

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acmod_set.c
# Opt level: O2

acmod_id_t acmod_set_name2id(acmod_set_t *acmod_set,char *name)

{
  uint uVar1;
  int iVar2;
  acmod_id_t aVar3;
  acmod_id_t left_context;
  acmod_id_t right_context;
  long lVar4;
  char *pcVar5;
  ulong uVar6;
  int n_scan;
  char posn [12];
  char base [1024];
  char right [1024];
  char left [1024];
  char tmp_store [1024];
  
  strcpy(tmp_store,name);
  iVar2 = __isoc99_sscanf(tmp_store,"%s%n",base,&n_scan);
  if (iVar2 == 1) {
    pcVar5 = tmp_store + n_scan;
    iVar2 = __isoc99_sscanf(pcVar5,"%s%n",left);
    if (iVar2 != 1) {
      uVar1 = acmod_set->n_ci;
      lVar4 = 0;
      uVar6 = 0;
      while( true ) {
        if (uVar1 == uVar6) {
          return 0xffffffff;
        }
        iVar2 = strcmp(*(char **)((long)&acmod_set->ci->name + lVar4),base);
        if (iVar2 == 0) break;
        uVar6 = uVar6 + 1;
        lVar4 = lVar4 + 0x18;
      }
      return (acmod_id_t)uVar6;
    }
    lVar4 = (long)n_scan;
    iVar2 = __isoc99_sscanf(pcVar5 + lVar4,"%s%n",right);
    if (iVar2 == 1) {
      iVar2 = __isoc99_sscanf(pcVar5 + lVar4 + n_scan,"%s%n",posn);
      if (iVar2 == 1) {
        aVar3 = acmod_set_name2id(acmod_set,base);
        left_context = acmod_set_name2id(acmod_set,left);
        right_context = acmod_set_name2id(acmod_set,right);
        for (lVar4 = 0; lVar4 != 5; lVar4 = lVar4 + 1) {
          if (posn[0] == "besiu"[lVar4]) {
            aVar3 = acmod_set_tri2id(acmod_set,aVar3,left_context,right_context,(word_posn_t)lVar4);
            return aVar3;
          }
        }
        pcVar5 = "Unknown word position identifier %s\n";
        name = posn;
        lVar4 = 0x1ea;
      }
      else {
        pcVar5 = "Parse error while getting word position of %s\n";
        lVar4 = 0x1db;
      }
    }
    else {
      pcVar5 = "Parse error while getting right context of %s\n";
      lVar4 = 0x1d2;
    }
  }
  else {
    pcVar5 = "Error parsing acoustic model name %s\n";
    lVar4 = 0x1be;
  }
  err_msg(ERR_ERROR,
          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libcommon/acmod_set.c"
          ,lVar4,pcVar5,name);
  return 0xffffffff;
}

Assistant:

acmod_id_t
acmod_set_name2id(acmod_set_t *acmod_set,
		  const char *name)
{
    uint32 i;
    char tmp_store[1024];
    char *tmp;
    int n_scan;
    int n_assign;
    char base[1024];
    acmod_id_t base_id;

    char left[1024];
    acmod_id_t left_id;

    char right[1024];
    acmod_id_t right_id;

    char *word_posn_map = WORD_POSN_CHAR_MAP;
    char posn[12];
    uint32 posn_id;

    strcpy(tmp_store, name);

    tmp = tmp_store;

    n_assign = sscanf(tmp, "%s%n", base, &n_scan);
    tmp += n_scan;

    if (n_assign != 1) {
	E_ERROR("Error parsing acoustic model name %s\n", name);
	return NO_ACMOD;
    }

    n_assign = sscanf(tmp, "%s%n", left, &n_scan);
    tmp += n_scan;
    
    if (n_assign != 1) {
	for (i = 0; i < acmod_set->n_ci; i++) {
	    if (strcmp(acmod_set->ci[i].name, base) == 0)
		return i;
	}
    
	return NO_ACMOD;
    }
    else {
	n_assign = sscanf(tmp, "%s%n", right, &n_scan);
	tmp += n_scan;
    
	if (n_assign != 1) {
	    E_ERROR("Parse error while getting right context of %s\n", name);

	    return NO_ACMOD;
	}

	n_assign = sscanf(tmp, "%s%n", posn, &n_scan);
	tmp += n_scan;
    
	if (n_assign != 1) {
	    E_ERROR("Parse error while getting word position of %s\n", name);
	    
	    return NO_ACMOD;
	}

	base_id  = acmod_set_name2id(acmod_set, base);
	left_id  = acmod_set_name2id(acmod_set, left);
	right_id = acmod_set_name2id(acmod_set, right);

	for (posn_id = 0; posn_id < strlen(word_posn_map); posn_id++) {
	    if (posn[0] == word_posn_map[(uint32)posn_id])
		break;
	}

	if (posn_id == strlen(word_posn_map)) {
	    E_ERROR("Unknown word position identifier %s\n", posn);

	    return NO_ACMOD;
	}
	
	return acmod_set_tri2id(acmod_set, base_id, left_id, right_id, (word_posn_t)posn_id);
    }
    
    return NO_ACMOD;
}